

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerSMC.cpp
# Opt level: O1

void chrono::
     _RemoveAllContacts<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<3>>,std::_List_iterator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<3>>*>>
               (list<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*>_>
                *contactlist,
               _List_iterator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*>
               *lastcontact,int *n_added)

{
  _List_node_base *p_Var1;
  
  for (p_Var1 = (contactlist->
                super__List_base<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*>_>
                )._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)contactlist;
      p_Var1 = (((_List_base<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*>_>
                  *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    if (p_Var1[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 8))();
    }
    p_Var1[1]._M_next = (_List_node_base *)0x0;
  }
  std::__cxx11::
  list<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*>_>
  ::clear(contactlist);
  lastcontact->_M_node =
       (contactlist->
       super__List_base<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*>_>
       )._M_impl._M_node.super__List_node_base._M_next;
  *n_added = 0;
  return;
}

Assistant:

void _RemoveAllContacts(std::list<Tcont*>& contactlist, Titer& lastcontact, int& n_added) {
    typename std::list<Tcont*>::iterator itercontact = contactlist.begin();
    while (itercontact != contactlist.end()) {
        delete (*itercontact);
        (*itercontact) = 0;
        ++itercontact;
    }
    contactlist.clear();
    lastcontact = contactlist.begin();
    n_added = 0;
}